

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O3

_Bool art_internal_validate_at(art_node_t *node,art_internal_validate_t validator)

{
  long lVar1;
  art_node_t aVar2;
  art_node_t *paVar3;
  art_internal_validate_t validator_00;
  art_internal_validate_t validator_01;
  art_internal_validate_t validator_02;
  art_internal_validate_t validator_03;
  art_validate_cb_t p_Var4;
  _Bool _Var5;
  int iVar6;
  char **ppcVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  int i;
  long lVar14;
  art_node_t *paVar15;
  undefined8 local_38;
  art_key_chunk_t aStack_30;
  art_key_chunk_t aStack_2f;
  undefined6 uStack_2e;
  
  iVar6 = validator.depth;
  ppcVar7 = validator.reason;
  if (node == (art_node_t *)0x0) {
    pcVar9 = "node is null";
  }
  else if (((ulong)node & 1) == 0) {
    aVar2 = node[1];
    if ((int)(validator.depth + (uint)(byte)aVar2) < 6) {
      memcpy(validator.current_key + validator.depth,node + 2,(ulong)(byte)aVar2);
      p_Var4 = validator.validate_cb;
      ppcVar7 = validator.reason;
      validator.depth = validator.depth + (uint)(byte)aVar2;
      switch(*node) {
      case (art_node_t)0x0:
        aStack_30 = validator.current_key[4];
        aStack_2f = validator.current_key[5];
        uStack_2e = validator._26_6_;
        aVar2 = node[7];
        if (aVar2 == (art_node_t)0x0) {
          pcVar9 = "Node4 has no children";
        }
        else if ((byte)aVar2 < 5) {
          if (aVar2 == (art_node_t)0x1) {
            pcVar9 = "Node4 and child node should have been combined";
          }
          else {
            local_38 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
            paVar15 = node + 0x18;
            lVar14 = -1;
            uVar8 = 0;
            while( true ) {
              uVar10 = (ulong)(byte)node[7];
              if (uVar10 <= uVar8) {
                return true;
              }
              if ((uVar8 != 0) && ((byte)node[uVar8 + 8] <= (byte)node[uVar8 + 7])) break;
              paVar3 = *(art_node_t **)(node + uVar8 * 8 + 0x10);
              if (uVar8 + 1 < uVar10) {
                lVar12 = 0;
                do {
                  if (paVar3 == *(art_node_t **)(paVar15 + lVar12 * 8)) {
                    pcVar9 = "Node4 has duplicate children";
                    goto LAB_00107039;
                  }
                  lVar12 = lVar12 + 1;
                } while (uVar10 + lVar14 != lVar12);
              }
              *(art_node_t *)((long)&local_38 + (long)(int)local_38 + 3) = node[uVar8 + 8];
              validator_02.validate_cb = p_Var4;
              validator_02.reason = ppcVar7;
              validator_02.depth = (int)local_38;
              validator_02.current_key[0] = local_38._4_1_;
              validator_02.current_key[1] = local_38._5_1_;
              validator_02.current_key[2] = local_38._6_1_;
              validator_02.current_key[3] = local_38._7_1_;
              validator_02.current_key[4] = aStack_30;
              validator_02.current_key[5] = aStack_2f;
              validator_02._26_6_ = uStack_2e;
              _Var5 = art_internal_validate_at(paVar3,validator_02);
              paVar15 = paVar15 + 8;
              lVar14 = lVar14 + -1;
              uVar8 = uVar8 + 1;
              if (!_Var5) {
                return false;
              }
            }
            pcVar9 = "Node4 keys are not strictly increasing";
          }
        }
        else {
          pcVar9 = "Node4 has too many children";
        }
        break;
      case (art_node_t)0x1:
        aStack_30 = validator.current_key[4];
        aStack_2f = validator.current_key[5];
        uStack_2e = validator._26_6_;
        if ((byte)node[7] < 5) {
          pcVar9 = "Node16 has too few children";
        }
        else if ((byte)node[7] < 0x11) {
          local_38 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
          paVar15 = node + 0x20;
          lVar14 = -1;
          uVar8 = 0;
          while( true ) {
            uVar10 = (ulong)(byte)node[7];
            if (uVar10 <= uVar8) {
              return true;
            }
            if ((uVar8 != 0) && ((byte)node[uVar8 + 8] <= (byte)node[uVar8 + 7])) break;
            paVar3 = *(art_node_t **)(node + uVar8 * 8 + 0x18);
            if (uVar8 + 1 < uVar10) {
              lVar12 = 0;
              do {
                if (paVar3 == *(art_node_t **)(paVar15 + lVar12 * 8)) {
                  pcVar9 = "Node16 has duplicate children";
                  goto LAB_00107039;
                }
                lVar12 = lVar12 + 1;
              } while (uVar10 + lVar14 != lVar12);
            }
            *(art_node_t *)((long)&local_38 + (long)(int)local_38 + 3) = node[uVar8 + 8];
            validator_01.validate_cb = p_Var4;
            validator_01.reason = ppcVar7;
            validator_01.depth = (int)local_38;
            validator_01.current_key[0] = local_38._4_1_;
            validator_01.current_key[1] = local_38._5_1_;
            validator_01.current_key[2] = local_38._6_1_;
            validator_01.current_key[3] = local_38._7_1_;
            validator_01.current_key[4] = aStack_30;
            validator_01.current_key[5] = aStack_2f;
            validator_01._26_6_ = uStack_2e;
            _Var5 = art_internal_validate_at(paVar3,validator_01);
            paVar15 = paVar15 + 8;
            lVar14 = lVar14 + -1;
            uVar8 = uVar8 + 1;
            if (!_Var5) {
              return false;
            }
          }
          pcVar9 = "Node16 keys are not strictly increasing";
        }
        else {
          pcVar9 = "Node16 has too many children";
        }
        break;
      case (art_node_t)0x2:
        aStack_30 = validator.current_key[4];
        aStack_2f = validator.current_key[5];
        uStack_2e = validator._26_6_;
        if ((byte)node[7] < 0x11) {
          pcVar9 = "Node48 has too few children";
        }
        else if ((byte)node[7] < 0x31) {
          lVar14 = 0;
          uVar8 = 0;
          do {
            uVar10 = (ulong)(byte)node[lVar14 + 0x10];
            if (uVar10 != 0x30) {
              if ((uVar8 >> (uVar10 & 0x3f) & 1) != 0) {
                pcVar9 = "Node48 keys point to the same child index";
                goto LAB_00107039;
              }
              if (*(long *)(node + uVar10 * 8 + 0x110) == 0) {
                pcVar9 = "Node48 has a NULL child";
                goto LAB_00107039;
              }
              uVar8 = uVar8 | 1L << ((byte)node[lVar14 + 0x10] & 0x3f);
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x100);
          if ((*(ulong *)(node + 8) ^ uVar8) == 0xffffffffffff) {
            if (uVar8 != 0) {
              while (uVar10 = uVar8 - 1 & uVar8, uVar10 != 0) {
                lVar14 = 0;
                if (uVar8 != 0) {
                  for (; (uVar8 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                  }
                }
                uVar11 = uVar10;
                do {
                  lVar12 = 0;
                  if (uVar11 != 0) {
                    for (; (uVar11 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                    }
                  }
                  if (*(long *)(node + lVar14 * 8 + 0x110) == *(long *)(node + lVar12 * 8 + 0x110))
                  {
                    pcVar9 = "Node48 has duplicate children";
                    goto LAB_00107039;
                  }
                  uVar11 = uVar11 & uVar11 - 1;
                  uVar8 = uVar10;
                } while (uVar11 != 0);
              }
            }
            local_38 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
            lVar14 = 0;
            do {
              aVar2 = node[lVar14 + 0x10];
              if ((ulong)(byte)aVar2 != 0x30) {
                *(char *)((long)&local_38 + (long)(int)local_38 + 3) = (char)lVar14;
                validator_03.validate_cb = p_Var4;
                validator_03.reason = ppcVar7;
                validator_03.depth = (int)local_38;
                validator_03.current_key[0] = local_38._4_1_;
                validator_03.current_key[1] = local_38._5_1_;
                validator_03.current_key[2] = local_38._6_1_;
                validator_03.current_key[3] = local_38._7_1_;
                validator_03.current_key[4] = aStack_30;
                validator_03.current_key[5] = aStack_2f;
                validator_03._26_6_ = uStack_2e;
                _Var5 = art_internal_validate_at
                                  (*(art_node_t **)(node + (ulong)(byte)aVar2 * 8 + 0x110),
                                   validator_03);
                if (!_Var5) {
                  return false;
                }
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 != 0x100);
            return true;
          }
          pcVar9 = "Node48 available_children does not match actual children";
        }
        else {
          pcVar9 = "Node48 has too many children";
        }
        break;
      case (art_node_t)0x3:
        aStack_30 = validator.current_key[4];
        aStack_2f = validator.current_key[5];
        uStack_2e = validator._26_6_;
        if (*(ushort *)(node + 8) < 0x31) {
          pcVar9 = "Node256 has too few children";
        }
        else if (*(ushort *)(node + 8) < 0x101) {
          local_38 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
          lVar14 = 0;
          uVar13 = 0;
          do {
            paVar15 = *(art_node_t **)(node + lVar14 * 8 + 0x10);
            if (paVar15 != (art_node_t *)0x0) {
              uVar13 = uVar13 + 1;
              lVar12 = lVar14;
              while (lVar12 != 0xff) {
                lVar1 = lVar12 * 8;
                lVar12 = lVar12 + 1;
                if (paVar15 == *(art_node_t **)(node + lVar1 + 0x18)) {
                  pcVar9 = "Node256 has duplicate children";
                  goto LAB_00107039;
                }
              }
              *(char *)((long)&local_38 + (long)(int)local_38 + 3) = (char)lVar14;
              validator_00.validate_cb = p_Var4;
              validator_00.reason = ppcVar7;
              validator_00.depth = (int)local_38;
              validator_00.current_key[0] = local_38._4_1_;
              validator_00.current_key[1] = local_38._5_1_;
              validator_00.current_key[2] = local_38._6_1_;
              validator_00.current_key[3] = local_38._7_1_;
              validator_00.current_key[4] = aStack_30;
              validator_00.current_key[5] = aStack_2f;
              validator_00._26_6_ = uStack_2e;
              _Var5 = art_internal_validate_at(paVar15,validator_00);
              if (!_Var5) {
                return false;
              }
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x100);
          if (uVar13 == *(ushort *)(node + 8)) {
            return true;
          }
          pcVar9 = "Node256 count does not match actual children";
        }
        else {
          pcVar9 = "Node256 has too many children";
        }
        break;
      default:
        pcVar9 = "invalid node type";
      }
    }
    else {
      pcVar9 = "node has too much prefix at given depth";
    }
  }
  else {
    uVar8 = (ulong)(byte)validator.depth;
    validator.depth = iVar6;
    iVar6 = bcmp((art_val_t *)((ulong)node & 0xfffffffffffffffe),validator.current_key,uVar8);
    ppcVar7 = validator.reason;
    if (iVar6 == 0) {
      if (validator.validate_cb == (art_validate_cb_t)0x0) {
        return true;
      }
      _Var5 = (*validator.validate_cb)
                        ((art_val_t *)((ulong)node & 0xfffffffffffffffe),validator.reason);
      if (!_Var5) {
        if (*ppcVar7 != (char *)0x0) {
          return false;
        }
        *ppcVar7 = "leaf validation failed";
        return false;
      }
      return true;
    }
    pcVar9 = "leaf key does not match its position\'s prefix in the tree";
  }
LAB_00107039:
  *ppcVar7 = pcVar9;
  return false;
}

Assistant:

static bool art_internal_validate_at(const art_node_t *node,
                                     art_internal_validate_t validator) {
    if (node == NULL) {
        return art_validate_fail(&validator, "node is null");
    }
    if (art_is_leaf(node)) {
        art_leaf_t *leaf = CAST_LEAF(node);
        if (art_compare_prefix(leaf->key, 0, validator.current_key, 0,
                               validator.depth) != 0) {
            return art_validate_fail(
                &validator,
                "leaf key does not match its position's prefix in the tree");
        }
        if (validator.validate_cb != NULL &&
            !validator.validate_cb(leaf, validator.reason)) {
            if (*validator.reason == NULL) {
                *validator.reason = "leaf validation failed";
            }
            return false;
        }
    } else {
        art_inner_node_t *inner_node = (art_inner_node_t *)node;

        if (validator.depth + inner_node->prefix_size + 1 > ART_KEY_BYTES) {
            return art_validate_fail(&validator,
                                     "node has too much prefix at given depth");
        }
        memcpy(validator.current_key + validator.depth, inner_node->prefix,
               inner_node->prefix_size);
        validator.depth += inner_node->prefix_size;

        switch (inner_node->typecode) {
            case ART_NODE4_TYPE:
                if (!art_node4_internal_validate((art_node4_t *)inner_node,
                                                 validator)) {
                    return false;
                }
                break;
            case ART_NODE16_TYPE:
                if (!art_node16_internal_validate((art_node16_t *)inner_node,
                                                  validator)) {
                    return false;
                }
                break;
            case ART_NODE48_TYPE:
                if (!art_node48_internal_validate((art_node48_t *)inner_node,
                                                  validator)) {
                    return false;
                }
                break;
            case ART_NODE256_TYPE:
                if (!art_node256_internal_validate((art_node256_t *)inner_node,
                                                   validator)) {
                    return false;
                }
                break;
            default:
                return art_validate_fail(&validator, "invalid node type");
        }
    }
    return true;
}